

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLsInitialize(void *arkode_mem)

{
  _func_SUNMatrix_ID_SUNMatrix *p_Var1;
  ARKLsMassMem pAVar2;
  bool bVar3;
  int iVar4;
  SUNMatrix_ID SVar5;
  SUNMatrix_ID SVar6;
  SUNLinearSolver_Type SVar7;
  void *pvVar8;
  SUNMatrix p_Var9;
  int error_code;
  ARKodeMem ark_mem_00;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKLsMassMem arkls_massmem;
  ARKLsMem arkls_mem;
  ARKodeMem local_40;
  ARKLsMassMem local_38;
  ARKLsMem local_30;
  
  iVar4 = arkLs_AccessLMem(arkode_mem,"arkLsInitialize",&local_40,&local_30);
  if (iVar4 != 0) {
    return iVar4;
  }
  local_38 = (ARKLsMassMem)0x0;
  if (((local_40->step_getmassmem != (ARKTimestepGetMassMemFn)0x0) &&
      (pvVar8 = (*local_40->step_getmassmem)(arkode_mem), pvVar8 != (void *)0x0)) &&
     (iVar4 = arkLs_AccessMassMem(arkode_mem,"arkLsInitialize",&local_40,&local_38), iVar4 != 0)) {
    return iVar4;
  }
  ark_mem_00 = local_40;
  p_Var9 = local_30->A;
  if (p_Var9 == (SUNMatrix)0x0) {
    local_30->jacDQ = 0;
    local_30->user_linsys = 0;
    local_30->jac = (ARKLsJacFn)0x0;
    local_30->J_data = (void *)0x0;
    local_30->linsys = (ARKLsLinSysFn)0x0;
    local_30->A_data = (void *)0x0;
LAB_004f0a8e:
    pAVar2 = local_38;
    if (local_38 == (ARKLsMassMem)0x0) {
LAB_004f0ba5:
      local_30->ncfl = 0;
      local_30->njtsetup = 0;
      local_30->nli = 0;
      local_30->nps = 0;
      local_30->nstlj = 0;
      local_30->npe = 0;
      local_30->nje = 0;
      local_30->nfeDQ = 0;
      local_30->njtimes = 0;
      if (local_30->jtimesDQ != 0) {
        local_30->jtsetup = (ARKLsJacTimesSetupFn)0x0;
        local_30->jtimes = arkLsDQJtimes;
        local_30->Jt_data = local_40;
      }
      if (((local_30->A == (SUNMatrix)0x0) && (local_30->pset == (ARKLsPrecSetupFn)0x0)) &&
         (local_40->step_disablelsetup != (ARKTimestepDisableLSetup)0x0)) {
        (*local_40->step_disablelsetup)(arkode_mem);
      }
      SVar7 = SUNLinSolGetType(local_30->LS);
      if (SVar7 == SUNLINEARSOLVER_MATRIX_EMBEDDED) {
        (*local_40->step_disablelsetup)(arkode_mem);
        local_30->scalesol = 0;
      }
      iVar4 = SUNLinSolInitialize(local_30->LS);
      goto LAB_004f0c58;
    }
    p_Var9 = local_30->A;
    if ((p_Var9 == (SUNMatrix)0x0) == (local_38->M == (SUNMatrix)0x0)) {
      if (p_Var9 != (SUNMatrix)0x0) {
        p_Var1 = p_Var9->ops->getid;
        bVar3 = (local_38->M->ops->getid == (_func_SUNMatrix_ID_SUNMatrix *)0x0) !=
                (p_Var1 == (_func_SUNMatrix_ID_SUNMatrix *)0x0);
        if (p_Var1 != (_func_SUNMatrix_ID_SUNMatrix *)0x0) {
          SVar5 = SUNMatGetID(p_Var9);
          SVar6 = SUNMatGetID(pAVar2->M);
          if (SVar5 != SVar6) {
            bVar3 = true;
          }
        }
        if (bVar3) {
          msgfmt = "System and mass matrices have incompatible types";
          ark_mem_00 = local_40;
          goto LAB_004f0b94;
        }
      }
      SVar7 = SUNLinSolGetType(local_30->LS);
      if (((SVar7 != SUNLINEARSOLVER_MATRIX_EMBEDDED) ||
          (SVar7 = SUNLinSolGetType(pAVar2->LS), SVar7 == SUNLINEARSOLVER_MATRIX_EMBEDDED)) &&
         ((SVar7 = SUNLinSolGetType(local_30->LS), SVar7 == SUNLINEARSOLVER_MATRIX_EMBEDDED ||
          (SVar7 = SUNLinSolGetType(pAVar2->LS), SVar7 != SUNLINEARSOLVER_MATRIX_EMBEDDED))))
      goto LAB_004f0ba5;
      msgfmt = "mismatched matrix-embedded LS types (system and mass must match)";
      ark_mem_00 = local_40;
    }
    else {
      msgfmt = "Cannot combine NULL and non-NULL System and mass matrices";
      ark_mem_00 = local_40;
    }
LAB_004f0b94:
    iVar4 = -3;
    error_code = -3;
  }
  else {
    if (local_30->user_linsys != 0) goto LAB_004f0a8e;
    local_30->linsys = arkLsLinSys;
    local_30->A_data = local_40;
    if (local_30->jacDQ != 0) {
      if ((p_Var9->ops->getid != (_func_SUNMatrix_ID_SUNMatrix *)0x0) &&
         ((SVar5 = SUNMatGetID(p_Var9), SVar5 == SUNMATRIX_DENSE ||
          (SVar5 = SUNMatGetID(local_30->A), SVar5 == SUNMATRIX_BAND)))) {
        local_30->jac = arkLsDQJac;
        local_30->J_data = ark_mem_00;
        goto LAB_004f0a31;
      }
      msgfmt = "No Jacobian constructor available for SUNMatrix type";
      goto LAB_004f0b94;
    }
LAB_004f0a31:
    if (local_30->savedJ != (SUNMatrix)0x0) goto LAB_004f0a8e;
    p_Var9 = SUNMatClone(local_30->A);
    local_30->savedJ = p_Var9;
    if (p_Var9 != (SUNMatrix)0x0) goto LAB_004f0a8e;
    msgfmt = "A memory request failed.";
    iVar4 = -4;
    error_code = -4;
  }
  arkProcessError(ark_mem_00,error_code,"ARKLS","arkLsInitialize",msgfmt);
LAB_004f0c58:
  local_30->last_flag = iVar4;
  return iVar4;
}

Assistant:

int arkLsInitialize(void* arkode_mem)
{
  ARKodeMem    ark_mem;
  ARKLsMem     arkls_mem;
  ARKLsMassMem arkls_massmem;
  int          retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLsInitialize",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* access ARKLsMassMem (if applicable) */
  arkls_massmem = NULL;
  if (ark_mem->step_getmassmem != NULL)
    if (ark_mem->step_getmassmem(arkode_mem) != NULL) {
      retval = arkLs_AccessMassMem(arkode_mem, "arkLsInitialize",
                                   &ark_mem, &arkls_massmem);
      if (retval != ARK_SUCCESS)  return(retval);
    }

  /* Test for valid combinations of matrix & Jacobian routines: */
  if (arkls_mem->A != NULL) {

    /* Matrix-based case */

    if (!arkls_mem->user_linsys) {

      /* Internal linear system function, reset pointers (just in case) */
      arkls_mem->linsys = arkLsLinSys;
      arkls_mem->A_data = ark_mem;

      /* Check if an internal or user-supplied Jacobian function is used */
      if (arkls_mem->jacDQ) {

        /* Internal difference quotient Jacobian. Check that A is dense or band,
           otherwise return an error */
        retval = 0;
        if (arkls_mem->A->ops->getid) {

          if ( (SUNMatGetID(arkls_mem->A) == SUNMATRIX_DENSE) ||
               (SUNMatGetID(arkls_mem->A) == SUNMATRIX_BAND) ) {
            arkls_mem->jac    = arkLsDQJac;
            arkls_mem->J_data = ark_mem;
          } else {
            retval++;
          }

        } else {
          retval++;
        }
        if (retval) {
          arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsInitialize",
                          "No Jacobian constructor available for SUNMatrix type");
          arkls_mem->last_flag = ARKLS_ILL_INPUT;
          return(ARKLS_ILL_INPUT);
        }
      }

      /* Allocate internally saved Jacobian if not already done */
      if (arkls_mem->savedJ == NULL) {
        arkls_mem->savedJ = SUNMatClone(arkls_mem->A);
        if (arkls_mem->savedJ == NULL) {
          arkProcessError(ark_mem, ARKLS_MEM_FAIL, "ARKLS",
                          "arkLsInitialize", MSG_LS_MEM_FAIL);
          arkls_mem->last_flag = ARKLS_MEM_FAIL;
          return(ARKLS_MEM_FAIL);
        }
      }

    } /* end matrix-based case */

  } else {

    /* Matrix-free case: ensure 'jac' and 'linsys' function pointers are NULL */
    arkls_mem->jacDQ  = SUNFALSE;
    arkls_mem->jac    = NULL;
    arkls_mem->J_data = NULL;

    arkls_mem->user_linsys = SUNFALSE;
    arkls_mem->linsys      = NULL;
    arkls_mem->A_data      = NULL;

  }


  /* Test for valid combination of system matrix and mass matrix (if applicable) */
  if (arkls_massmem) {

    /* A and M must both be NULL or non-NULL */
    if ( (arkls_mem->A==NULL) ^ (arkls_massmem->M==NULL) ) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsInitialize",
                      "Cannot combine NULL and non-NULL System and mass matrices");
      arkls_mem->last_flag = ARKLS_ILL_INPUT;
      return(ARKLS_ILL_INPUT);
    }

    /* If A is non-NULL, A and M must have matching types (if accessible) */
    if (arkls_mem->A) {
      retval = 0;
      if ((arkls_mem->A->ops->getid==NULL) ^ (arkls_massmem->M->ops->getid==NULL))
        retval++;
      if (arkls_mem->A->ops->getid)
        if (SUNMatGetID(arkls_mem->A) != SUNMatGetID(arkls_massmem->M))
          retval++;
      if (retval) {
        arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsInitialize",
                        "System and mass matrices have incompatible types");
        arkls_mem->last_flag = ARKLS_ILL_INPUT;
        return(ARKLS_ILL_INPUT);
      }
    }

    /* If either system or mass matrix solver is matrix-embedded, then both must be */
    if ((SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (SUNLinSolGetType(arkls_massmem->LS) != SUNLINEARSOLVER_MATRIX_EMBEDDED)) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsInitialize",
                      "mismatched matrix-embedded LS types (system and mass must match)");
      arkls_mem->last_flag = ARKLS_ILL_INPUT;
      return(ARKLS_ILL_INPUT);
    }
    if ((SUNLinSolGetType(arkls_mem->LS) != SUNLINEARSOLVER_MATRIX_EMBEDDED) &&
        (SUNLinSolGetType(arkls_massmem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED)) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLsInitialize",
                      "mismatched matrix-embedded LS types (system and mass must match)");
      arkls_mem->last_flag = ARKLS_ILL_INPUT;
      return(ARKLS_ILL_INPUT);
    }
  }

  /* reset counters */
  arkLsInitializeCounters(arkls_mem);

  /* Set Jacobian-vector product related fields, based on jtimesDQ */
  if (arkls_mem->jtimesDQ) {
    arkls_mem->jtsetup = NULL;
    arkls_mem->jtimes  = arkLsDQJtimes;
    arkls_mem->Jt_data = ark_mem;
  }

  /* If A is NULL and psetup is not present, then arkLsSetup does
     not need to be called, so set the lsetup function to NULL (if possible) */
  if ( (arkls_mem->A == NULL) &&
       (arkls_mem->pset == NULL) &&
       (ark_mem->step_disablelsetup != NULL) )
    ark_mem->step_disablelsetup(arkode_mem);

  /* When using a matrix-embedded linear solver, disable lsetup call and solution scaling */
  if (SUNLinSolGetType(arkls_mem->LS) == SUNLINEARSOLVER_MATRIX_EMBEDDED) {
    ark_mem->step_disablelsetup(arkode_mem);
    arkls_mem->scalesol = SUNFALSE;
  }

  /* Call LS initialize routine, and return result */
  arkls_mem->last_flag = SUNLinSolInitialize(arkls_mem->LS);
  return(arkls_mem->last_flag);
}